

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O1

int __thiscall tetgenmesh::facetfacetadjacent(tetgenmesh *this,face *subsh1,face *subsh2)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  point *ppdVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  iVar2 = *(int *)((long)subsh1->sh + (long)this->shmarkindex * 4 + 8);
  iVar3 = *(int *)((long)subsh2->sh + (long)this->shmarkindex * 4 + 8);
  uVar6 = 0;
  if (iVar2 != iVar3) {
    piVar4 = this->idx2facetlist;
    lVar7 = (long)piVar4[iVar2];
    if (piVar4[iVar2] < piVar4[(long)iVar2 + 1]) {
      ppdVar5 = this->facetverticeslist;
      do {
        puVar1 = (uint *)((long)ppdVar5[lVar7] + (long)this->pointmarkindex * 4 + 4);
        *puVar1 = *puVar1 | 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 < piVar4[(long)iVar2 + 1]);
    }
    lVar7 = (long)piVar4[iVar3];
    uVar6 = 0;
    if (piVar4[iVar3] < piVar4[(long)iVar3 + 1]) {
      iVar8 = 0;
      do {
        iVar8 = iVar8 + (*(uint *)((long)this->facetverticeslist[lVar7] +
                                  (long)this->pointmarkindex * 4 + 4) & 1);
        lVar7 = lVar7 + 1;
      } while (piVar4[(long)iVar3 + 1] != lVar7);
      uVar6 = (uint)(0 < iVar8);
    }
    lVar7 = (long)piVar4[iVar2];
    if (piVar4[iVar2] < piVar4[(long)iVar2 + 1]) {
      ppdVar5 = this->facetverticeslist;
      do {
        puVar1 = (uint *)((long)ppdVar5[lVar7] + (long)this->pointmarkindex * 4 + 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar7 = lVar7 + 1;
      } while (lVar7 < piVar4[(long)iVar2 + 1]);
    }
  }
  return uVar6;
}

Assistant:

inline int tetgenmesh::getfacetindex(face& s)
{
  return ((int *) (s.sh))[shmarkindex + 2];
}